

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

Statement *
slang::ast::BreakStatement::fromSyntax
          (Compilation *compilation,JumpStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  bitmask<slang::ast::StatementFlags> bVar2;
  Compilation *in_RDX;
  SourceRange *in_RDI;
  SourceRange SVar3;
  SourceRange SVar4;
  BreakStatement *result;
  undefined4 in_stack_ffffffffffffff88;
  StatementFlags in_stack_ffffffffffffff8c;
  bitmask<slang::ast::StatementFlags> *in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  DiagCode code;
  undefined8 local_8;
  
  SVar3 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RDX);
  code = SVar3.startLoc._4_4_;
  local_8 = &BumpAllocator::emplace<slang::ast::BreakStatement,slang::SourceRange>
                       (in_stack_ffffffffffffffa0,in_RDI)->super_Statement;
  bVar2 = ast::operator|((StatementFlags)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  bVar1 = bitmask<slang::ast::StatementFlags>::has
                    (in_stack_ffffffffffffff90,
                     (bitmask<slang::ast::StatementFlags> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    uVar5 = 0x470008;
    SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RDX);
    SVar3.endLoc._0_4_ = uVar5;
    SVar3.startLoc = SVar4.endLoc;
    SVar3.endLoc._4_4_ = bVar2.m_bits;
    ASTContext::addDiag((ASTContext *)SVar4.startLoc,code,SVar3);
    local_8 = Statement::badStmt(in_RDX,(Statement *)
                                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ));
  }
  return local_8;
}

Assistant:

Statement& BreakStatement::fromSyntax(Compilation& compilation, const JumpStatementSyntax& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    auto result = compilation.emplace<BreakStatement>(syntax.sourceRange());
    if (!stmtCtx.flags.has(StatementFlags::InLoop | StatementFlags::InRandSeq)) {
        context.addDiag(diag::StatementNotInLoop, syntax.sourceRange());
        return badStmt(compilation, result);
    }
    return *result;
}